

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::JunitReporter::writeGroup(JunitReporter *this,TestGroupNode *groupNode,double suiteTime)

{
  XmlWriter *this_00;
  pointer psVar1;
  XmlWriter *this_01;
  int iVar2;
  tm *__tp;
  undefined4 extraout_var;
  shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>
  *child;
  pointer psVar3;
  allocator local_db;
  allocator local_da;
  allocator local_d9;
  string local_d8;
  string local_b8;
  char timeStamp [21];
  undefined1 local_78 [16];
  time_t rawtime;
  ScopedElement properties;
  double suiteTime_local;
  ScopedElement e;
  
  suiteTime_local = suiteTime;
  std::__cxx11::string::string((string *)&local_d8,"testsuite",(allocator *)&local_b8);
  this_00 = &this->xml;
  XmlWriter::scopedElement((XmlWriter *)&e,(string *)this_00,(XmlFormatting)&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::string((string *)&local_d8,"name",(allocator *)&local_b8);
  XmlWriter::writeAttribute(this_00,&local_d8,&(groupNode->value).groupInfo.name);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::string((string *)&local_d8,"errors",(allocator *)&local_b8);
  XmlWriter::writeAttribute<unsigned_int>(this_00,&local_d8,&this->unexpectedExceptions);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::string((string *)&local_d8,"failures",(allocator *)timeStamp);
  local_b8._M_dataplus._M_p =
       (pointer)((groupNode->value).totals.assertions.failed - (ulong)this->unexpectedExceptions);
  XmlWriter::writeAttribute<unsigned_long>(this_00,&local_d8,(unsigned_long *)&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::string((string *)&local_d8,"tests",(allocator *)timeStamp);
  local_b8._M_dataplus._M_p =
       (pointer)((groupNode->value).totals.assertions.failed +
                 (groupNode->value).totals.assertions.passed +
                (groupNode->value).totals.assertions.failedButOk);
  XmlWriter::writeAttribute<unsigned_long>(this_00,&local_d8,(unsigned_long *)&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::string((string *)&local_d8,"hostname",(allocator *)&local_b8);
  XmlWriter::writeAttribute<char[4]>(this_00,&local_d8,(char (*) [4])"tbd");
  std::__cxx11::string::~string((string *)&local_d8);
  iVar2 = (*(((this->super_CumulativeReporterBase<Catch::JunitReporter>).m_config.
              super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            super_NonCopyable)._vptr_NonCopyable[0xb])();
  if (iVar2 == 2) {
    std::__cxx11::string::string((string *)&local_d8,"time",(allocator *)&local_b8);
    XmlWriter::writeAttribute<char[1]>(this_00,&local_d8,(char (*) [1])0x2296e7);
  }
  else {
    std::__cxx11::string::string((string *)&local_d8,"time",(allocator *)&local_b8);
    XmlWriter::writeAttribute<double>(this_00,&local_d8,&suiteTime_local);
  }
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::string((string *)&local_d8,"timestamp",(allocator *)local_78);
  time(&rawtime);
  __tp = gmtime(&rawtime);
  strftime(timeStamp,0x15,"%Y-%m-%dT%H:%M:%SZ",__tp);
  std::__cxx11::string::string((string *)&local_b8,timeStamp,(allocator *)&properties);
  XmlWriter::writeAttribute(this_00,&local_d8,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  iVar2 = (*(((this->super_CumulativeReporterBase<Catch::JunitReporter>).m_config.
              super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            super_NonCopyable)._vptr_NonCopyable[0xe])();
  if ((char)iVar2 == '\0') {
    iVar2 = (*(((this->super_CumulativeReporterBase<Catch::JunitReporter>).m_config.
                super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_NonCopyable)._vptr_NonCopyable[0x11])();
    if (iVar2 == 0) goto LAB_001ebfc7;
  }
  std::__cxx11::string::string((string *)&local_d8,"properties",(allocator *)&local_b8);
  XmlWriter::scopedElement((XmlWriter *)&properties,(string *)this_00,(XmlFormatting)&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  iVar2 = (*(((this->super_CumulativeReporterBase<Catch::JunitReporter>).m_config.
              super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            super_NonCopyable)._vptr_NonCopyable[0xe])();
  if ((char)iVar2 != '\0') {
    std::__cxx11::string::string((string *)&local_d8,"property",&local_d9);
    XmlWriter::scopedElement((XmlWriter *)local_78,(string *)this_00,(XmlFormatting)&local_d8);
    std::__cxx11::string::string((string *)&local_b8,"name",&local_da);
    this_01 = (XmlWriter *)CONCAT44(local_78._4_4_,local_78._0_4_);
    XmlWriter::writeAttribute<char[8]>(this_01,&local_b8,(char (*) [8])"filters");
    std::__cxx11::string::string((string *)timeStamp,"value",&local_db);
    iVar2 = (*(((this->super_CumulativeReporterBase<Catch::JunitReporter>).m_config.
                super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_NonCopyable)._vptr_NonCopyable[0xf])();
    serializeFilters((string *)&rawtime,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)CONCAT44(extraout_var,iVar2));
    XmlWriter::writeAttribute(this_01,(string *)timeStamp,(string *)&rawtime);
    std::__cxx11::string::~string((string *)&rawtime);
    std::__cxx11::string::~string((string *)timeStamp);
    std::__cxx11::string::~string((string *)&local_b8);
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_78);
    std::__cxx11::string::~string((string *)&local_d8);
  }
  iVar2 = (*(((this->super_CumulativeReporterBase<Catch::JunitReporter>).m_config.
              super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            super_NonCopyable)._vptr_NonCopyable[0x11])();
  if (iVar2 != 0) {
    std::__cxx11::string::string((string *)&local_d8,"property",&local_d9);
    XmlWriter::scopedElement((XmlWriter *)&rawtime,(string *)this_00,(XmlFormatting)&local_d8);
    std::__cxx11::string::string((string *)&local_b8,"name",&local_da);
    XmlWriter::writeAttribute<char[12]>((XmlWriter *)rawtime,&local_b8,(char (*) [12])"random-seed")
    ;
    std::__cxx11::string::string((string *)timeStamp,"value",&local_db);
    local_78._0_4_ =
         (*(((this->super_CumulativeReporterBase<Catch::JunitReporter>).m_config.
             super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           super_NonCopyable)._vptr_NonCopyable[0x11])();
    XmlWriter::writeAttribute<unsigned_int>
              ((XmlWriter *)rawtime,(string *)timeStamp,(uint *)local_78);
    std::__cxx11::string::~string((string *)timeStamp);
    std::__cxx11::string::~string((string *)&local_b8);
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)&rawtime);
    std::__cxx11::string::~string((string *)&local_d8);
  }
  XmlWriter::ScopedElement::~ScopedElement(&properties);
LAB_001ebfc7:
  psVar1 = (groupNode->children).
           super__Vector_base<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar3 = (groupNode->children).
                super__Vector_base<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar3 != psVar1; psVar3 = psVar3 + 1) {
    writeTestCase(this,(psVar3->
                       super___shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,_(__gnu_cxx::_Lock_policy)2>
                       )._M_ptr);
  }
  std::__cxx11::string::string((string *)&local_d8,"system-out",(allocator *)&rawtime);
  XmlWriter::scopedElement((XmlWriter *)timeStamp,(string *)this_00,(XmlFormatting)&local_d8);
  trim(&local_b8,&this->stdOutForSuite);
  XmlWriter::writeText((XmlWriter *)timeStamp._0_8_,&local_b8,Newline);
  std::__cxx11::string::~string((string *)&local_b8);
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)timeStamp);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::string((string *)&local_d8,"system-err",(allocator *)&rawtime);
  XmlWriter::scopedElement((XmlWriter *)timeStamp,(string *)this_00,(XmlFormatting)&local_d8);
  trim(&local_b8,&this->stdErrForSuite);
  XmlWriter::writeText((XmlWriter *)timeStamp._0_8_,&local_b8,Newline);
  std::__cxx11::string::~string((string *)&local_b8);
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)timeStamp);
  std::__cxx11::string::~string((string *)&local_d8);
  XmlWriter::ScopedElement::~ScopedElement(&e);
  return;
}

Assistant:

void JunitReporter::writeGroup( TestGroupNode const& groupNode, double suiteTime ) {
        XmlWriter::ScopedElement e = xml.scopedElement( "testsuite" );

        TestGroupStats const& stats = groupNode.value;
        xml.writeAttribute( "name", stats.groupInfo.name );
        xml.writeAttribute( "errors", unexpectedExceptions );
        xml.writeAttribute( "failures", stats.totals.assertions.failed-unexpectedExceptions );
        xml.writeAttribute( "tests", stats.totals.assertions.total() );
        xml.writeAttribute( "hostname", "tbd" ); // !TBD
        if( m_config->showDurations() == ShowDurations::Never )
            xml.writeAttribute( "time", "" );
        else
            xml.writeAttribute( "time", suiteTime );
        xml.writeAttribute( "timestamp", getCurrentTimestamp() );

        // Write properties if there are any
        if (m_config->hasTestFilters() || m_config->rngSeed() != 0) {
            auto properties = xml.scopedElement("properties");
            if (m_config->hasTestFilters()) {
                xml.scopedElement("property")
                    .writeAttribute("name", "filters")
                    .writeAttribute("value", serializeFilters(m_config->getTestsOrTags()));
            }
            if (m_config->rngSeed() != 0) {
                xml.scopedElement("property")
                    .writeAttribute("name", "random-seed")
                    .writeAttribute("value", m_config->rngSeed());
            }
        }

        // Write test cases
        for( auto const& child : groupNode.children )
            writeTestCase( *child );

        xml.scopedElement( "system-out" ).writeText( trim( stdOutForSuite ), XmlFormatting::Newline );
        xml.scopedElement( "system-err" ).writeText( trim( stdErrForSuite ), XmlFormatting::Newline );
    }